

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# squall_coroutine.hpp
# Opt level: O0

void __thiscall squall::Coroutine::resume<int>(Coroutine *this,int v)

{
  SQRESULT SVar1;
  squirrel_error *this_00;
  SQBool in_stack_00000028;
  SQBool in_stack_00000030;
  SQBool in_stack_00000038;
  SQBool in_stack_00000040;
  HSQUIRRELVM in_stack_00000048;
  int local_14;
  Coroutine *pCStack_10;
  int v_local;
  Coroutine *this_local;
  
  local_14 = v;
  pCStack_10 = this;
  validate_vm(this);
  detail::push<int>(this->vm_,&local_14);
  SVar1 = sq_wakeupvm(in_stack_00000048,in_stack_00000040,in_stack_00000038,in_stack_00000030,
                      in_stack_00000028);
  if (SVar1 < 0) {
    this_00 = (squirrel_error *)__cxa_allocate_exception(0x10);
    squirrel_error::runtime_error(this_00,"wake up vm failed");
    __cxa_throw(this_00,&squirrel_error::typeinfo,squirrel_error::~squirrel_error);
  }
  check_suspended(this);
  return;
}

Assistant:

void resume(T v) {
        validate_vm();
        detail::push(vm_, v);
        if (!SQ_SUCCEEDED(sq_wakeupvm(vm_, SQTrue, SQTrue, SQTrue, SQFalse))) {
            throw squirrel_error("wake up vm failed");
        }
        check_suspended();
    }